

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O0

vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
* FixedDegreeNetwork::generate_block_links
            (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *__return_storage_ptr__,uint degree,uint blocks)

{
  uint uVar1;
  reference pvVar2;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  value_type_conflict local_54;
  _Base_ptr local_50;
  undefined1 local_48;
  value_type_conflict local_3c;
  uint local_38;
  uint local_34;
  uint node_j;
  uint node_i;
  uint block_i;
  allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>
  local_1e;
  undefined1 local_1d;
  uint local_1c;
  uint local_18;
  uint nodes_per_block;
  uint blocks_local;
  uint degree_local;
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  *links;
  
  local_1c = degree + 1;
  local_1d = 0;
  uVar1 = local_1c * blocks;
  local_18 = blocks;
  nodes_per_block = degree;
  _blocks_local = __return_storage_ptr__;
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  allocator(&local_1e);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__,(ulong)uVar1,&local_1e);
  std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>::
  ~allocator(&local_1e);
  for (node_j = 0; node_j < local_18; node_j = node_j + 1) {
    for (local_34 = 0; local_38 = local_34, local_34 < local_1c; local_34 = local_34 + 1) {
      while (local_38 = local_38 + 1, local_38 < local_1c) {
        pvVar2 = std::
                 vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](__return_storage_ptr__,(ulong)(local_34 + local_1c * node_j));
        local_3c = local_38 + local_1c * node_j;
        pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert(pvVar2,&local_3c);
        local_50 = (_Base_ptr)pVar3.first._M_node;
        local_48 = pVar3.second;
        pvVar2 = std::
                 vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](__return_storage_ptr__,(ulong)(local_38 + local_1c * node_j));
        local_54 = local_34 + local_1c * node_j;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                  (pvVar2,&local_54);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::set<unsigned int> > generate_block_links(unsigned int degree,
                                                                     unsigned int blocks) {
        unsigned int nodes_per_block = degree + 1;
        std::vector<std::set<unsigned int> > links(nodes_per_block*blocks);

        for (unsigned int block_i = 0; block_i < blocks; block_i++)
            for (unsigned int node_i = 0; node_i < nodes_per_block; node_i++)
                for (unsigned int node_j = node_i + 1; node_j < nodes_per_block; node_j++) {
                    links[node_i + nodes_per_block*block_i].insert(node_j + nodes_per_block*block_i);
                    links[node_j + nodes_per_block*block_i].insert(node_i + nodes_per_block*block_i);
                }
        return links;
    }